

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImStb::stb_textedit_move_to_last(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int temp;
  
  iVar1 = state->select_start;
  iVar2 = state->select_end;
  if (iVar1 != iVar2) {
    iVar3 = iVar2;
    iVar4 = iVar1;
    if (iVar2 < iVar1) {
      state->select_end = iVar1;
      iVar3 = iVar1;
      iVar4 = iVar2;
    }
    if (iVar1 != iVar2) {
      iVar1 = str->CurLenW;
      if (iVar1 <= iVar4) {
        iVar4 = iVar1;
      }
      if (iVar1 < iVar3) {
        state->select_end = iVar1;
        iVar3 = iVar1;
      }
      if (iVar4 == iVar3) {
        state->cursor = iVar4;
        iVar3 = iVar4;
      }
    }
    state->cursor = iVar3;
    state->select_start = iVar3;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_move_to_last(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   if (STB_TEXT_HAS_SELECTION(state)) {
      stb_textedit_sortselection(state);
      stb_textedit_clamp(str, state);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
      state->has_preferred_x = 0;
   }
}